

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O1

void __thiscall
Shell::PredicateDefinition::PredData::add
          (PredData *this,int polarity,int add,PredicateDefinition *pdObj)

{
  if (polarity == 1) {
    this->pocc = this->pocc + add;
  }
  else if (polarity == 0) {
    this->docc = this->docc + add;
  }
  else if (polarity == -1) {
    this->nocc = this->nocc + add;
  }
  if (add != -1) {
    return;
  }
  check(this,pdObj);
  return;
}

Assistant:

void add(int polarity, int add, PredicateDefinition* pdObj)
  {
    switch (polarity) {
    case -1:
      nocc += add;
      break;
    case 0:
      docc += add;
      break;
    case 1:
      pocc += add;
      break;
#if VDEBUG
    default:
      ASSERTION_VIOLATION;
      return;
#endif
    }
    if(add==-1) {
      check(pdObj);
    }
  }